

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cpp
# Opt level: O0

void __thiscall
arbiter::drivers::Http::post
          (Http *this,string *path,vector<char,_std::allocator<char>_> *data,Headers *headers,
          Query *query)

{
  bool bVar1;
  ArbiterError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  string local_c0;
  undefined1 local_a0 [8];
  Response res;
  Resource http;
  Query *query_local;
  Headers *headers_local;
  vector<char,_std::allocator<char>_> *data_local;
  string *path_local;
  Http *this_local;
  
  arbiter::http::Pool::acquire
            ((Resource *)&res.m_headers._M_t._M_impl.super__Rb_tree_header._M_node_count,
             this->m_pool);
  typedPath(&local_c0,this,path);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&local_100,headers);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&local_130,query);
  arbiter::http::Resource::post
            ((Response *)local_a0,
             (Resource *)&res.m_headers._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_c0,
             (vector<char,_std::allocator<char>_> *)data,&local_100,&local_130);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_130);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_100);
  ::std::__cxx11::string::~string((string *)&local_c0);
  bVar1 = arbiter::http::Response::ok((Response *)local_a0);
  if (!bVar1) {
    this_00 = (ArbiterError *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_150,"Couldn\'t HTTP POST to ",path);
    ArbiterError::ArbiterError(this_00,&local_150);
    __cxa_throw(this_00,&ArbiterError::typeinfo,ArbiterError::~ArbiterError);
  }
  arbiter::http::Response::~Response((Response *)local_a0);
  arbiter::http::Resource::~Resource
            ((Resource *)&res.m_headers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void Http::post(
        const std::string path,
        const std::vector<char>& data,
        const Headers headers,
        const Query query) const
{
    auto http(m_pool.acquire());
    auto res(http.post(typedPath(path), data, headers, query));

    if (!res.ok())
    {
        throw ArbiterError("Couldn't HTTP POST to " + path);
    }
}